

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xeTestLogParser.cpp
# Opt level: O0

void __thiscall xe::TestLogParser::parse(TestLogParser *this,deUint8 *bytes,size_t numBytes)

{
  bool bVar1;
  deBool dVar2;
  Error *pEVar3;
  TestCaseResultData *pTVar4;
  deUint8 *pdVar5;
  ContainerParseError *this_00;
  allocator<char> local_141;
  string local_140;
  int local_120;
  int local_11c;
  int numDataBytes;
  int offset;
  ParseError *anon_var_0;
  char *reason;
  undefined1 local_100 [4];
  TestStatusCode statusCode;
  char *local_f0;
  char *casePath;
  string local_e0;
  char *local_c0;
  char *value;
  char *attribute;
  string local_a8;
  undefined1 local_82;
  allocator<char> local_81;
  string local_80;
  undefined1 local_5d;
  allocator<char> local_49;
  string local_48;
  ContainerElement local_24;
  size_t sStack_20;
  ContainerElement element;
  size_t numBytes_local;
  deUint8 *bytes_local;
  TestLogParser *this_local;
  
  sStack_20 = numBytes;
  numBytes_local = (size_t)bytes;
  bytes_local = (deUint8 *)this;
  ContainerFormatParser::feed(&this->m_containerParser,bytes,numBytes);
  do {
    local_24 = ContainerFormatParser::getElement(&this->m_containerParser);
    if (local_24 == CONTAINERELEMENT_INCOMPLETE) {
      return;
    }
    switch(local_24) {
    case CONTAINERELEMENT_END_OF_STRING:
      bVar1 = de::SharedPtr::operator_cast_to_bool((SharedPtr *)&this->m_currentCaseData);
      if (bVar1) {
        pTVar4 = de::SharedPtr<xe::TestCaseResultData>::operator->(&this->m_currentCaseData);
        TestCaseResultData::setTestResult
                  (pTVar4,TESTSTATUSCODE_TERMINATED,"Unexpected end of string");
        (*this->m_handler->_vptr_TestLogHandler[5])(this->m_handler,&this->m_currentCaseData);
      }
      de::SharedPtr<xe::TestCaseResultData>::clear(&this->m_currentCaseData);
      break;
    case CONTAINERELEMENT_BEGIN_SESSION:
      if ((this->m_inSession & 1U) != 0) {
        local_5d = 1;
        pEVar3 = (Error *)__cxa_allocate_exception(0x10);
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&local_48,"Unexpected #beginSession",&local_49);
        Error::Error(pEVar3,&local_48);
        local_5d = 0;
        __cxa_throw(pEVar3,&Error::typeinfo,Error::~Error);
      }
      (*this->m_handler->_vptr_TestLogHandler[2])(this->m_handler,&this->m_sessionInfo);
      this->m_inSession = true;
      break;
    case CONTAINERELEMENT_END_SESSION:
      if ((this->m_inSession & 1U) == 0) {
        local_82 = 1;
        pEVar3 = (Error *)__cxa_allocate_exception(0x10);
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&local_80,"Unexpected #endSession",&local_81);
        Error::Error(pEVar3,&local_80);
        local_82 = 0;
        __cxa_throw(pEVar3,&Error::typeinfo,Error::~Error);
      }
      this->m_inSession = false;
      break;
    case CONTAINERELEMENT_SESSION_INFO:
      if ((this->m_inSession & 1U) != 0) {
        attribute._6_1_ = 1;
        pEVar3 = (Error *)__cxa_allocate_exception(0x10);
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&local_a8,"Unexpected #sessionInfo",
                   (allocator<char> *)((long)&attribute + 7));
        Error::Error(pEVar3,&local_a8);
        attribute._6_1_ = 0;
        __cxa_throw(pEVar3,&Error::typeinfo,Error::~Error);
      }
      value = ContainerFormatParser::getSessionInfoAttribute(&this->m_containerParser);
      local_c0 = ContainerFormatParser::getSessionInfoValue(&this->m_containerParser);
      dVar2 = deStringEqual(value,"releaseName");
      if (dVar2 == 0) {
        dVar2 = deStringEqual(value,"releaseId");
        if (dVar2 == 0) {
          dVar2 = deStringEqual(value,"targetName");
          if (dVar2 == 0) {
            dVar2 = deStringEqual(value,"candyTargetName");
            if (dVar2 == 0) {
              dVar2 = deStringEqual(value,"configName");
              if (dVar2 == 0) {
                dVar2 = deStringEqual(value,"resultName");
                if (dVar2 == 0) {
                  dVar2 = deStringEqual(value,"timestamp");
                  if (dVar2 != 0) {
                    std::__cxx11::string::operator=
                              ((string *)&(this->m_sessionInfo).timestamp,local_c0);
                  }
                }
                else {
                  std::__cxx11::string::operator=
                            ((string *)&(this->m_sessionInfo).resultName,local_c0);
                }
              }
              else {
                std::__cxx11::string::operator=
                          ((string *)&(this->m_sessionInfo).configName,local_c0);
              }
            }
            else {
              std::__cxx11::string::operator=
                        ((string *)&(this->m_sessionInfo).candyTargetName,local_c0);
            }
          }
          else {
            std::__cxx11::string::operator=((string *)&(this->m_sessionInfo).targetName,local_c0);
          }
        }
        else {
          std::__cxx11::string::operator=((string *)&(this->m_sessionInfo).releaseId,local_c0);
        }
      }
      else {
        std::__cxx11::string::operator=((string *)&this->m_sessionInfo,local_c0);
      }
      break;
    case CONTAINERELEMENT_BEGIN_TEST_CASE_RESULT:
      if ((this->m_inSession & 1U) == 0) {
        casePath._6_1_ = 1;
        pEVar3 = (Error *)__cxa_allocate_exception(0x10);
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&local_e0,"Unexpected #beginTestCaseResult",
                   (allocator<char> *)((long)&casePath + 7));
        Error::Error(pEVar3,&local_e0);
        casePath._6_1_ = 0;
        __cxa_throw(pEVar3,&Error::typeinfo,Error::~Error);
      }
      local_f0 = ContainerFormatParser::getTestCasePath(&this->m_containerParser);
      (*this->m_handler->_vptr_TestLogHandler[3])
                ((SharedPtr<xe::TestCaseResultData> *)local_100,this->m_handler,local_f0);
      de::SharedPtr<xe::TestCaseResultData>::operator=
                (&this->m_currentCaseData,(SharedPtr<xe::TestCaseResultData> *)local_100);
      de::SharedPtr<xe::TestCaseResultData>::~SharedPtr
                ((SharedPtr<xe::TestCaseResultData> *)local_100);
      pTVar4 = de::SharedPtr<xe::TestCaseResultData>::operator->(&this->m_currentCaseData);
      TestCaseResultData::setDataSize(pTVar4,0);
      pTVar4 = de::SharedPtr<xe::TestCaseResultData>::operator->(&this->m_currentCaseData);
      TestCaseResultData::setTestResult(pTVar4,TESTSTATUSCODE_RUNNING,"Running");
      (*this->m_handler->_vptr_TestLogHandler[4])(this->m_handler,&this->m_currentCaseData);
      break;
    case CONTAINERELEMENT_END_TEST_CASE_RESULT:
      bVar1 = de::SharedPtr::operator_cast_to_bool((SharedPtr *)&this->m_currentCaseData);
      if (bVar1) {
        pTVar4 = de::SharedPtr<xe::TestCaseResultData>::operator->(&this->m_currentCaseData);
        TestCaseResultData::setTestResult(pTVar4,TESTSTATUSCODE_LAST,"");
        (*this->m_handler->_vptr_TestLogHandler[5])(this->m_handler,&this->m_currentCaseData);
      }
      de::SharedPtr<xe::TestCaseResultData>::clear(&this->m_currentCaseData);
      break;
    case CONTAINERELEMENT_TERMINATE_TEST_CASE_RESULT:
      bVar1 = de::SharedPtr::operator_cast_to_bool((SharedPtr *)&this->m_currentCaseData);
      if (bVar1) {
        reason._4_4_ = 0xb;
        anon_var_0 = (ParseError *)
                     ContainerFormatParser::getTerminateReason(&this->m_containerParser);
        reason._4_4_ = getTestStatusCode((char *)anon_var_0);
        pTVar4 = de::SharedPtr<xe::TestCaseResultData>::operator->(&this->m_currentCaseData);
        TestCaseResultData::setTestResult(pTVar4,reason._4_4_,(char *)anon_var_0);
        (*this->m_handler->_vptr_TestLogHandler[5])(this->m_handler,&this->m_currentCaseData);
      }
      de::SharedPtr<xe::TestCaseResultData>::clear(&this->m_currentCaseData);
      break;
    case CONTAINERELEMENT_TEST_LOG_DATA:
      bVar1 = de::SharedPtr::operator_cast_to_bool((SharedPtr *)&this->m_currentCaseData);
      if (bVar1) {
        pTVar4 = de::SharedPtr<xe::TestCaseResultData>::operator->(&this->m_currentCaseData);
        local_11c = TestCaseResultData::getDataSize(pTVar4);
        local_120 = ContainerFormatParser::getDataSize(&this->m_containerParser);
        pTVar4 = de::SharedPtr<xe::TestCaseResultData>::operator->(&this->m_currentCaseData);
        TestCaseResultData::setDataSize(pTVar4,local_11c + local_120);
        pTVar4 = de::SharedPtr<xe::TestCaseResultData>::operator->(&this->m_currentCaseData);
        pdVar5 = TestCaseResultData::getData(pTVar4);
        ContainerFormatParser::getData(&this->m_containerParser,pdVar5 + local_11c,local_120,0);
        (*this->m_handler->_vptr_TestLogHandler[4])(this->m_handler,&this->m_currentCaseData);
      }
      break;
    default:
      this_00 = (ContainerParseError *)__cxa_allocate_exception(0x10);
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_140,"Unknown container element",&local_141);
      ContainerParseError::ContainerParseError(this_00,&local_140);
      __cxa_throw(this_00,&ContainerParseError::typeinfo,ContainerParseError::~ContainerParseError);
    }
    ContainerFormatParser::advance(&this->m_containerParser);
  } while( true );
}

Assistant:

void TestLogParser::parse (const deUint8* bytes, size_t numBytes)
{
	m_containerParser.feed(bytes, numBytes);

	for (;;)
	{
		ContainerElement element = m_containerParser.getElement();

		if (element == CONTAINERELEMENT_INCOMPLETE)
			break;

		switch (element)
		{
			case CONTAINERELEMENT_BEGIN_SESSION:
			{
				if (m_inSession)
					throw Error("Unexpected #beginSession");

				m_handler->setSessionInfo(m_sessionInfo);
				m_inSession = true;
				break;
			}

			case CONTAINERELEMENT_END_SESSION:
			{
				if (!m_inSession)
					throw Error("Unexpected #endSession");

				m_inSession = false;
				break;
			}

			case CONTAINERELEMENT_SESSION_INFO:
			{
				if (m_inSession)
					throw Error("Unexpected #sessionInfo");

				const char*		attribute	= m_containerParser.getSessionInfoAttribute();
				const char*		value		= m_containerParser.getSessionInfoValue();

				if (deStringEqual(attribute, "releaseName"))
					m_sessionInfo.releaseName = value;
				else if (deStringEqual(attribute, "releaseId"))
					m_sessionInfo.releaseId = value;
				else if (deStringEqual(attribute, "targetName"))
					m_sessionInfo.targetName = value;
				else if (deStringEqual(attribute, "candyTargetName"))
					m_sessionInfo.candyTargetName = value;
				else if (deStringEqual(attribute, "configName"))
					m_sessionInfo.configName = value;
				else if (deStringEqual(attribute, "resultName"))
					m_sessionInfo.resultName = value;
				else if (deStringEqual(attribute, "timestamp"))
					m_sessionInfo.timestamp = value;

				// \todo [2012-06-09 pyry] What to do with unknown/duplicate attributes? Currently just ignored.
				break;
			}

			case CONTAINERELEMENT_BEGIN_TEST_CASE_RESULT:
			{
				if (!m_inSession)
					throw Error("Unexpected #beginTestCaseResult");

				const char* casePath = m_containerParser.getTestCasePath();
				m_currentCaseData = m_handler->startTestCaseResult(casePath);

				// Clear and set to running state.
				m_currentCaseData->setDataSize(0);
				m_currentCaseData->setTestResult(TESTSTATUSCODE_RUNNING, "Running");

				m_handler->testCaseResultUpdated(m_currentCaseData);
				break;
			}

			case CONTAINERELEMENT_END_TEST_CASE_RESULT:
				if (m_currentCaseData)
				{
					// \todo [2012-06-16 pyry] Parse status code already here?
					m_currentCaseData->setTestResult(TESTSTATUSCODE_LAST, "");
					m_handler->testCaseResultComplete(m_currentCaseData);
				}
				m_currentCaseData.clear();
				break;

			case CONTAINERELEMENT_TERMINATE_TEST_CASE_RESULT:
				if (m_currentCaseData)
				{
					TestStatusCode	statusCode	= TESTSTATUSCODE_CRASH;
					const char*		reason		= m_containerParser.getTerminateReason();
					try
					{
						statusCode = getTestStatusCode(reason);
					}
					catch (const xe::ParseError&)
					{
						// Could not map status code.
					}
					m_currentCaseData->setTestResult(statusCode, reason);
					m_handler->testCaseResultComplete(m_currentCaseData);
				}
				m_currentCaseData.clear();
				break;

			case CONTAINERELEMENT_END_OF_STRING:
				if (m_currentCaseData)
				{
					// Terminate current case.
					m_currentCaseData->setTestResult(TESTSTATUSCODE_TERMINATED, "Unexpected end of string");
					m_handler->testCaseResultComplete(m_currentCaseData);
				}
				m_currentCaseData.clear();
				break;

			case CONTAINERELEMENT_TEST_LOG_DATA:
				if (m_currentCaseData)
				{
					int offset			= m_currentCaseData->getDataSize();
					int	numDataBytes	= m_containerParser.getDataSize();

					m_currentCaseData->setDataSize(offset+numDataBytes);
					m_containerParser.getData(m_currentCaseData->getData()+offset, numDataBytes, 0);

					m_handler->testCaseResultUpdated(m_currentCaseData);
				}
				break;

			default:
				throw ContainerParseError("Unknown container element");
		}

		m_containerParser.advance();
	}
}